

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

BVSparse<Memory::JitArenaAllocator> * __thiscall
BVSparse<Memory::JitArenaAllocator>::OrNew
          (BVSparse<Memory::JitArenaAllocator> *this,BVSparse<Memory::JitArenaAllocator> *bv)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  BVSparse<Memory::JitArenaAllocator> *bv_local;
  BVSparse<Memory::JitArenaAllocator> *this_local;
  
  pBVar1 = OrNew(this,bv,this->alloc);
  return pBVar1;
}

Assistant:

BVSparse<TAllocator> *      OrNew(const BVSparse<TAllocator> *bv) const { return this->OrNew(bv, this->alloc); }